

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestReader.cpp
# Opt level: O2

void __thiscall OpenMD::RestReader::readSet(RestReader *this)

{
  istream *inputStream;
  long lVar1;
  string line;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  std::ios::clear((int)this->inFile_ + (int)this->inFile_->_vptr_basic_istream[-3]);
  std::istream::seekg(this->inFile_,this->framePos_,0);
  inputStream = this->inFile_;
  std::istream::getline((char *)inputStream,(long)this->buffer);
  std::__cxx11::string::assign((char *)&local_38);
  lVar1 = std::__cxx11::string::find((char *)&local_38,0x20adee);
  if (lVar1 == -1) {
    builtin_strncpy(painCave.errMsg + 0x20,"Snapshot>\n",0xb);
    builtin_strncpy(painCave.errMsg + 0x10,": can not find <",0x10);
    builtin_strncpy(painCave.errMsg,"RestReader Error",0x10);
    painCave.isFatal = 1;
    simError();
  }
  readFrameProperties(this,inputStream);
  readStuntDoubles(this,inputStream);
  std::istream::getline((char *)inputStream,(long)this->buffer);
  std::__cxx11::string::assign((char *)&local_38);
  lVar1 = std::__cxx11::string::find((char *)&local_38,0x20ae35);
  if (lVar1 == -1) {
    builtin_strncpy(painCave.errMsg + 0x20,"/Snapshot>\n",0xc);
    builtin_strncpy(painCave.errMsg + 0x10,": can not find <",0x10);
    builtin_strncpy(painCave.errMsg,"RestReader Error",0x10);
    painCave.isFatal = 1;
    simError();
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void RestReader::readSet() {
    std::string line;

#ifndef IS_MPI

    inFile_->clear();
    inFile_->seekg(framePos_);

    std::istream& inputStream = *inFile_;
#else

    int primaryNode = 0;
    std::stringstream sstream;
    if (worldRank == primaryNode) {
      std::string sendBuffer;

      inFile_->clear();
      inFile_->seekg(framePos_);

      while (inFile_->getline(buffer, bufferSize)) {
        line = buffer;
        sendBuffer += line;
        sendBuffer += '\n';
        if (line.find("</Snapshot>") != std::string::npos) { break; }
      }

      int sendBufferSize = sendBuffer.size();
      MPI_Bcast(&sendBufferSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
      MPI_Bcast((void*)sendBuffer.c_str(), sendBufferSize, MPI_CHAR,
                primaryNode, MPI_COMM_WORLD);

      sstream.str(sendBuffer);
    } else {
      int sendBufferSize;
      MPI_Bcast(&sendBufferSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
      char* recvBuffer = new char[sendBufferSize + 1];
      assert(recvBuffer);
      recvBuffer[sendBufferSize] = '\0';
      MPI_Bcast(recvBuffer, sendBufferSize, MPI_CHAR, primaryNode,
                MPI_COMM_WORLD);
      sstream.str(recvBuffer);
      delete[] recvBuffer;
    }

    std::istream& inputStream = sstream;
#endif

    inputStream.getline(buffer, bufferSize);

    line = buffer;
    if (line.find("<Snapshot>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RestReader Error: can not find <Snapshot>\n");
      painCave.isFatal = 1;
      simError();
    }

    // read frameData
    readFrameProperties(inputStream);

    // read StuntDoubles
    readStuntDoubles(inputStream);

    inputStream.getline(buffer, bufferSize);
    line = buffer;
    if (line.find("</Snapshot>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RestReader Error: can not find </Snapshot>\n");
      painCave.isFatal = 1;
      simError();
    }
  }